

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboDepthbufferTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BasicFboDepthCase::render(BasicFboDepthCase *this,Surface *dst)

{
  int width;
  int height;
  deUint32 program;
  float fVar1;
  Surface *dst_00;
  DataTypes *samplerTypes;
  Context *pCVar2;
  void *data_00;
  Vector<float,_4> local_4a0;
  Vector<float,_4> local_490;
  TextureFormat local_480;
  Vector<float,_3> local_478;
  Vector<float,_3> local_46c;
  PixelBufferAccess local_460;
  Vector<float,_4> local_438;
  Vector<float,_4> local_428;
  PixelBufferAccess local_418;
  TextureFormat local_3f0;
  undefined1 local_3e8 [8];
  TextureLevel data;
  deUint32 gridTex;
  int texH;
  int texW;
  deUint32 dataType;
  deUint32 format;
  Vector<float,_3> local_39c;
  Vector<float,_4> local_390;
  Vector<float,_4> local_380;
  float local_370;
  deUint32 local_36c;
  float clearDepth;
  deUint32 texShaderID;
  deUint32 gradShaderID;
  Vector<float,_4> local_354;
  DataTypes local_338;
  undefined1 local_318 [8];
  Texture2DShader texShader;
  GradientShader gradShader;
  deUint32 depthRbo;
  deUint32 colorRbo;
  deUint32 fbo;
  deUint32 colorFormat;
  Surface *dst_local;
  BasicFboDepthCase *this_local;
  
  colorRbo = 0x8058;
  depthRbo = 0;
  gradShader.super_ShaderProgram._340_4_ = 0;
  gradShader.super_ShaderProgram.m_hasGeometryShader = false;
  gradShader.super_ShaderProgram._337_3_ = 0;
  _fbo = dst;
  dst_local = (Surface *)this;
  FboTestUtil::GradientShader::GradientShader
            ((GradientShader *)&texShader.m_outputType,TYPE_FLOAT_VEC4);
  local_338.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_338);
  samplerTypes = FboTestUtil::DataTypes::operator<<(&local_338,TYPE_SAMPLER_2D);
  tcu::Vector<float,_4>::Vector(&local_354,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&texShaderID,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_318,samplerTypes,TYPE_FLOAT_VEC4,&local_354,
             (Vec4 *)&texShaderID);
  FboTestUtil::DataTypes::~DataTypes(&local_338);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  clearDepth = (float)(*pCVar2->_vptr_Context[0x75])(pCVar2,&texShader.m_outputType);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  local_36c = (*pCVar2->_vptr_Context[0x75])(pCVar2,local_318);
  local_370 = 1.0;
  pCVar2 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  fVar1 = clearDepth;
  tcu::Vector<float,_4>::Vector(&local_380,0.0);
  tcu::Vector<float,_4>::Vector(&local_390,1.0);
  FboTestUtil::GradientShader::setGradient
            ((GradientShader *)&texShader.m_outputType,pCVar2,(deUint32)fVar1,&local_380,&local_390)
  ;
  pCVar2 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_318,pCVar2,local_36c);
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,&depthRbo);
  sglr::ContextWrapper::glGenRenderbuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,
             (deUint32 *)&gradShader.super_ShaderProgram.field_0x154);
  sglr::ContextWrapper::glGenRenderbuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,
             (deUint32 *)&gradShader.super_ShaderProgram.m_hasGeometryShader);
  sglr::ContextWrapper::glBindRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,
             gradShader.super_ShaderProgram._340_4_);
  sglr::ContextWrapper::glRenderbufferStorage
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,0x8058,this->m_width,
             this->m_height);
  sglr::ContextWrapper::glBindRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,
             gradShader.super_ShaderProgram._336_4_);
  sglr::ContextWrapper::glRenderbufferStorage
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,this->m_format,this->m_width,
             this->m_height);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,depthRbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0x8d41,
             gradShader.super_ShaderProgram._340_4_);
  sglr::ContextWrapper::glFramebufferRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d00,0x8d41,
             gradShader.super_ShaderProgram._336_4_);
  FboTestCase::checkError(&this->super_FboTestCase);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glViewport
            (&(this->super_FboTestCase).super_ContextWrapper,0,0,this->m_width,this->m_height);
  sglr::ContextWrapper::glClearBufferfv
            (&(this->super_FboTestCase).super_ContextWrapper,0x1801,0,&local_370);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  fVar1 = clearDepth;
  tcu::Vector<float,_3>::Vector(&local_39c,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&dataType,1.0,1.0,1.0);
  sglr::drawQuad(pCVar2,(deUint32)fVar1,&local_39c,(Vec3 *)&dataType);
  data.m_data.m_cap._4_4_ = 0;
  local_3f0 = glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_3e8,&local_3f0,0x80,0x80,1);
  tcu::TextureLevel::getAccess(&local_418,(TextureLevel *)local_3e8);
  tcu::Vector<float,_4>::Vector(&local_428,0.2,0.7,0.1,1.0);
  tcu::Vector<float,_4>::Vector(&local_438,0.7,0.1,0.5,0.8);
  tcu::fillWithGrid(&local_418,8,&local_428,&local_438);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_FboTestCase).super_ContextWrapper,1,
             (deUint32 *)((long)&data.m_data.m_cap + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,data.m_data.m_cap._4_4_);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2802,0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2803,0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2801,0x2601);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2800,0x2601);
  tcu::TextureLevel::getAccess(&local_460,(TextureLevel *)local_3e8);
  data_00 = tcu::PixelBufferAccess::getDataPtr(&local_460);
  sglr::ContextWrapper::glTexImage2D
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0,0x1908,0x80,0x80,0,0x1908,
             0x1401,data_00);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  program = local_36c;
  tcu::Vector<float,_3>::Vector(&local_46c,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_478,1.0,1.0,0.0);
  sglr::drawQuad(pCVar2,program,&local_46c,&local_478);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_3e8);
  dst_00 = _fbo;
  width = this->m_width;
  height = this->m_height;
  local_480 = glu::mapGLInternalFormat(0x8058);
  tcu::Vector<float,_4>::Vector(&local_490,1.0);
  tcu::Vector<float,_4>::Vector(&local_4a0,0.0);
  FboTestCase::readPixels
            (&this->super_FboTestCase,dst_00,0,0,width,height,&local_480,&local_490,&local_4a0);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_318);
  FboTestUtil::GradientShader::~GradientShader((GradientShader *)&texShader.m_outputType);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const deUint32	colorFormat		= GL_RGBA8;
		deUint32		fbo				= 0;
		deUint32		colorRbo		= 0;
		deUint32		depthRbo		= 0;
		GradientShader	gradShader		(glu::TYPE_FLOAT_VEC4);
		Texture2DShader	texShader		(DataTypes() << glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC4);
		deUint32		gradShaderID	= getCurrentContext()->createProgram(&gradShader);
		deUint32		texShaderID		= getCurrentContext()->createProgram(&texShader);
		float			clearDepth		= 1.0f;

		// Setup shaders
		gradShader.setGradient(*getCurrentContext(), gradShaderID, tcu::Vec4(0.0f), tcu::Vec4(1.0f));
		texShader.setUniforms (*getCurrentContext(), texShaderID);

		// Setup FBO

		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &colorRbo);
		glGenRenderbuffers(1, &depthRbo);

		glBindRenderbuffer(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorage(GL_RENDERBUFFER, colorFormat, m_width, m_height);

		glBindRenderbuffer(GL_RENDERBUFFER, depthRbo);
		glRenderbufferStorage(GL_RENDERBUFFER, m_format, m_width, m_height);

		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthRbo);
		checkError();
		checkFramebufferStatus(GL_FRAMEBUFFER);

		glViewport(0, 0, m_width, m_height);

		// Clear depth to 1
		glClearBufferfv(GL_DEPTH, 0, &clearDepth);

		// Render gradient with depth = [-1..1]
		glEnable(GL_DEPTH_TEST);
		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		// Render grid pattern with depth = 0
		{
			const deUint32		format		= GL_RGBA;
			const deUint32		dataType	= GL_UNSIGNED_BYTE;
			const int			texW		= 128;
			const int			texH		= 128;
			deUint32			gridTex		= 0;
			tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

			tcu::fillWithGrid(data.getAccess(), 8, Vec4(0.2f, 0.7f, 0.1f, 1.0f), Vec4(0.7f, 0.1f, 0.5f, 0.8f));

			glGenTextures(1, &gridTex);
			glBindTexture(GL_TEXTURE_2D, gridTex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

			sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		// Read results.
		readPixels(dst, 0, 0, m_width, m_height, glu::mapGLInternalFormat(colorFormat), Vec4(1.0f), Vec4(0.0f));
	}